

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,capnp::Type&>
          (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> *this,
          ArrayPtr<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table,
          Type *params)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  HandlerBase *pHVar7;
  Entry *pEVar8;
  Type *in_R8;
  ulong uVar9;
  Maybe<unsigned_long> MVar10;
  
  pEVar8 = table.ptr;
  lVar1._0_2_ = pEVar8[1].key.baseType;
  lVar1._2_1_ = pEVar8[1].key.listDepth;
  lVar1._3_1_ = pEVar8[1].key.isImplicitParam;
  lVar1._4_2_ = pEVar8[1].key.field_3;
  lVar1._6_2_ = *(undefined2 *)&pEVar8[1].key.field_0x6;
  if (lVar1 == 0) {
    *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0;
    aVar6.value = table.size_;
  }
  else {
    uVar4 = capnp::Type::hashCode(in_R8);
    uVar9 = (ulong)(*(int *)&pEVar8[1].key - 1U & uVar4);
    iVar5 = *(int *)((long)&pEVar8->value[uVar9]._vptr_HandlerBase + 4);
    aVar6 = extraout_RDX;
    if (iVar5 != 0) {
      pHVar7 = pEVar8->value + uVar9;
      do {
        if (((iVar5 != 1) && (*(uint *)&pHVar7->_vptr_HandlerBase == uVar4)) &&
           (bVar3 = capnp::Type::operator==((Type *)(table.size_ + (ulong)(iVar5 - 2) * 0x18),in_R8)
           , aVar6 = extraout_RDX_00, bVar3)) {
          iVar5 = *(int *)((long)&pHVar7->_vptr_HandlerBase + 4);
          *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x1
          ;
          *(ulong *)(this + 8) = (ulong)(iVar5 - 2);
          goto LAB_00187b91;
        }
        uVar2._0_2_ = pEVar8[1].key.baseType;
        uVar2._2_1_ = pEVar8[1].key.listDepth;
        uVar2._3_1_ = pEVar8[1].key.isImplicitParam;
        uVar2._4_2_ = pEVar8[1].key.field_3;
        uVar2._6_2_ = *(undefined2 *)&pEVar8[1].key.field_0x6;
        if (uVar9 + 1 == uVar2) {
          uVar9 = 0;
        }
        else {
          uVar9 = uVar9 + 1 & 0xffffffff;
        }
        pHVar7 = pEVar8->value + uVar9;
        iVar5 = *(int *)((long)&pHVar7->_vptr_HandlerBase + 4);
      } while (iVar5 != 0);
    }
    *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0;
  }
LAB_00187b91:
  MVar10.ptr.field_1.value = aVar6.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }